

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_ecdh_generator_basepoint(void)

{
  int iVar1;
  secp256k1_scalar s;
  size_t point_ser_len;
  uchar point_ser [65];
  uchar output_ser [32];
  uchar output_ecdh [65];
  uchar s_b32 [32];
  secp256k1_sha256 sha;
  int i;
  secp256k1_pubkey point [2];
  uchar s_one [32];
  secp256k1_scalar *in_stack_fffffffffffffdd8;
  uchar *in_stack_fffffffffffffde0;
  uchar *in_stack_fffffffffffffde8;
  secp256k1_sha256 *in_stack_fffffffffffffdf0;
  undefined1 local_1f8 [52];
  uint in_stack_fffffffffffffe3c;
  secp256k1_pubkey *in_stack_fffffffffffffe40;
  size_t *in_stack_fffffffffffffe48;
  uchar *in_stack_fffffffffffffe50;
  secp256k1_context *in_stack_fffffffffffffe58;
  secp256k1_pubkey *in_stack_fffffffffffffe60;
  secp256k1_context *in_stack_fffffffffffffe68;
  undefined1 local_188 [152];
  void *in_stack_ffffffffffffff10;
  secp256k1_ecdh_hash_function in_stack_ffffffffffffff18;
  uchar *in_stack_ffffffffffffff20;
  secp256k1_pubkey *in_stack_ffffffffffffff28;
  uchar *in_stack_ffffffffffffff30;
  secp256k1_context *in_stack_ffffffffffffff38;
  int local_ac;
  undefined1 local_28 [31];
  undefined1 local_9;
  
  memset(local_28,0,0x20);
  local_9 = 1;
  local_ac = 0;
  while( true ) {
    if (SBORROW4(local_ac,COUNT * 2) == local_ac + COUNT * -2 < 0) {
      return;
    }
    testutil_random_scalar_order((secp256k1_scalar *)0x41);
    secp256k1_scalar_get_b32(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    iVar1 = secp256k1_ec_pubkey_create
                      (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                       (uchar *)in_stack_fffffffffffffe58);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ecdh/tests_impl.h"
              ,0x3e,"test condition failed: secp256k1_ec_pubkey_create(CTX, &point[0], s_one) == 1")
      ;
      abort();
    }
    iVar1 = secp256k1_ec_pubkey_create
                      (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                       (uchar *)in_stack_fffffffffffffe58);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ecdh/tests_impl.h"
              ,0x3f,"test condition failed: secp256k1_ec_pubkey_create(CTX, &point[1], s_b32) == 1")
      ;
      abort();
    }
    iVar1 = secp256k1_ecdh(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                           in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                           in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ecdh/tests_impl.h"
              ,0x42,
              "test condition failed: secp256k1_ecdh(CTX, output_ecdh, &point[0], s_b32, ecdh_hash_function_custom, NULL) == 1"
             );
      abort();
    }
    iVar1 = secp256k1_ec_pubkey_serialize
                      (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48
                       ,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ecdh/tests_impl.h"
              ,0x44,
              "test condition failed: secp256k1_ec_pubkey_serialize(CTX, point_ser, &point_ser_len, &point[1], SECP256K1_EC_UNCOMPRESSED) == 1"
             );
      abort();
    }
    iVar1 = secp256k1_memcmp_var(local_188,local_1f8,0x41);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ecdh/tests_impl.h"
              ,0x46,"test condition failed: secp256k1_memcmp_var(output_ecdh, point_ser, 65) == 0");
      abort();
    }
    iVar1 = secp256k1_ecdh(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                           in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                           in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    if (iVar1 != 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ecdh/tests_impl.h"
              ,0x49,
              "test condition failed: secp256k1_ecdh(CTX, output_ecdh, &point[0], s_b32, NULL, NULL) == 1"
             );
      abort();
    }
    iVar1 = secp256k1_ec_pubkey_serialize
                      (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48
                       ,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    if (iVar1 != 1) break;
    secp256k1_sha256_initialize((secp256k1_sha256 *)(local_188 + 0x70));
    secp256k1_sha256_write
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,(size_t)in_stack_fffffffffffffde0
              );
    secp256k1_sha256_finalize(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    iVar1 = secp256k1_memcmp_var(local_188,&stack0xfffffffffffffe58,0x20);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ecdh/tests_impl.h"
              ,0x50,"test condition failed: secp256k1_memcmp_var(output_ecdh, output_ser, 32) == 0")
      ;
      abort();
    }
    local_ac = local_ac + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/ecdh/tests_impl.h"
          ,0x4b,
          "test condition failed: secp256k1_ec_pubkey_serialize(CTX, point_ser, &point_ser_len, &point[1], SECP256K1_EC_COMPRESSED) == 1"
         );
  abort();
}

Assistant:

static void test_ecdh_generator_basepoint(void) {
    unsigned char s_one[32] = { 0 };
    secp256k1_pubkey point[2];
    int i;

    s_one[31] = 1;
    /* Check against pubkey creation when the basepoint is the generator */
    for (i = 0; i < 2 * COUNT; ++i) {
        secp256k1_sha256 sha;
        unsigned char s_b32[32];
        unsigned char output_ecdh[65];
        unsigned char output_ser[32];
        unsigned char point_ser[65];
        size_t point_ser_len = sizeof(point_ser);
        secp256k1_scalar s;

        testutil_random_scalar_order(&s);
        secp256k1_scalar_get_b32(s_b32, &s);

        CHECK(secp256k1_ec_pubkey_create(CTX, &point[0], s_one) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &point[1], s_b32) == 1);

        /* compute using ECDH function with custom hash function */
        CHECK(secp256k1_ecdh(CTX, output_ecdh, &point[0], s_b32, ecdh_hash_function_custom, NULL) == 1);
        /* compute "explicitly" */
        CHECK(secp256k1_ec_pubkey_serialize(CTX, point_ser, &point_ser_len, &point[1], SECP256K1_EC_UNCOMPRESSED) == 1);
        /* compare */
        CHECK(secp256k1_memcmp_var(output_ecdh, point_ser, 65) == 0);

        /* compute using ECDH function with default hash function */
        CHECK(secp256k1_ecdh(CTX, output_ecdh, &point[0], s_b32, NULL, NULL) == 1);
        /* compute "explicitly" */
        CHECK(secp256k1_ec_pubkey_serialize(CTX, point_ser, &point_ser_len, &point[1], SECP256K1_EC_COMPRESSED) == 1);
        secp256k1_sha256_initialize(&sha);
        secp256k1_sha256_write(&sha, point_ser, point_ser_len);
        secp256k1_sha256_finalize(&sha, output_ser);
        /* compare */
        CHECK(secp256k1_memcmp_var(output_ecdh, output_ser, 32) == 0);
    }
}